

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O2

void Q_SetLen(QMatrix *Q,size_t RoC,size_t Len)

{
  LASErrIdType LVar1;
  ElType *pEVar2;
  char *Object1Name;
  bool bVar3;
  LASErrIdType LStack_20;
  
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    return;
  }
  if (RoC == 0 || Q->Instance != Normal) {
    if (Q->Instance != Normal) {
      Object1Name = Q->Name;
      LStack_20 = LASLValErr;
      goto LAB_0010dadc;
    }
  }
  else if (RoC <= Q->Dim) {
    Q->Len[RoC] = Len;
    free(Q->El[RoC]);
    if (Len == 0) {
      Q->El[RoC] = (ElType *)0x0;
      return;
    }
    pEVar2 = (ElType *)malloc(Len << 4);
    Q->El[RoC] = pEVar2;
    if (pEVar2 != (ElType *)0x0) {
      while (bVar3 = Len != 0, Len = Len - 1, bVar3) {
        *pEVar2 = ZeroEl;
        pEVar2 = pEVar2 + 1;
      }
      return;
    }
    Object1Name = Q->Name;
    LStack_20 = LASMemAllocErr;
    goto LAB_0010dadc;
  }
  Object1Name = Q->Name;
  LStack_20 = LASRangeErr;
LAB_0010dadc:
  LASError(LStack_20,"Q_SetLen",Object1Name,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void Q_SetLen(QMatrix *Q, size_t RoC, size_t Len)
/* set the lenght of a row or column of the matrix Q */
{
    size_t ElCount;
    ElType *PtrEl;

    if (LASResult() == LASOK) {
        if (Q->Instance == Normal && RoC > 0 && RoC <= Q->Dim) {
            Q->Len[RoC] = Len;

            PtrEl = Q->El[RoC];

            if (PtrEl != NULL) {
                free(PtrEl);
		PtrEl = NULL;
	    }

            if (Len > 0) {
                PtrEl = (ElType *)malloc(Len * sizeof(ElType));
                Q->El[RoC] = PtrEl;

                if (PtrEl != NULL) {
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        *PtrEl = ZeroEl;
                        PtrEl++;
                    }
                } else {
                    LASError(LASMemAllocErr, "Q_SetLen", Q->Name, NULL, NULL);
                }
            } else {
                Q->El[RoC] = NULL;
            }
        } else {
            if (Q->Instance != Normal)
                LASError(LASLValErr, "Q_SetLen", Q->Name, NULL, NULL);
            else
                LASError(LASRangeErr, "Q_SetLen", Q->Name, NULL, NULL);
        }
    }
}